

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

bool __thiscall
rlottie::internal::renderer::Stroke::updateContent
          (Stroke *this,int frameNo,VMatrix *matrix,float alpha)

{
  Filter<rlottie::internal::model::Stroke> *this_00;
  vector<float,_std::allocator<float>_> *result;
  float miterLimit;
  CapStyle cap;
  JoinStyle join;
  Stroke *pSVar1;
  pointer pfVar2;
  float *elm;
  long lVar3;
  pointer pfVar4;
  Drawable *this_01;
  float fVar5;
  float fVar6;
  Color CVar7;
  VColor color;
  VBrush brush;
  VColor local_54;
  VPointF local_50;
  VPointF local_48;
  VBrush local_40;
  
  this_00 = &this->mModel;
  fVar5 = model::Filter<rlottie::internal::model::Stroke>::opacity(this_00,frameNo);
  CVar7 = model::Filter<rlottie::internal::model::Stroke>::color(this_00,frameNo);
  local_54 = (VColor)((int)(fVar5 * alpha * 255.0) & 0xffU |
                     ((int)(CVar7.r * 255.0) & 0xffU) << 8 |
                     ((int)(CVar7.g * 255.0) & 0xffU) << 0x10 | (int)(CVar7.b * 255.0) << 0x18);
  VBrush::VBrush(&local_40,&local_54);
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.mType = local_40.mType;
  *(undefined4 *)&(this->super_Paint).mDrawable.super_VDrawable.mBrush.field_0x4 = local_40._4_4_;
  (this->super_Paint).mDrawable.super_VDrawable.mBrush.field_1 = local_40.field_1;
  this_01 = &(this->super_Paint).mDrawable;
  local_48.mx = 0.0;
  local_48.my = 0.0;
  local_50.mx = 1.41421;
  local_50.my = 1.41421;
  local_48 = VMatrix::map(matrix,&local_48);
  local_50 = VMatrix::map(matrix,&local_50);
  fVar5 = (local_50.mx - local_48.mx) * (local_50.mx - local_48.mx) +
          (local_50.my - local_48.my) * (local_50.my - local_48.my);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  pSVar1 = (this_00->super_FilterBase<rlottie::internal::model::Stroke>).model_;
  cap = pSVar1->mCapStyle;
  join = pSVar1->mJoinStyle;
  miterLimit = pSVar1->mMiterLimit;
  fVar6 = model::Filter<rlottie::internal::model::Stroke>::strokeWidth(this_00,frameNo);
  VDrawable::setStrokeInfo(&this_01->super_VDrawable,cap,join,miterLimit,fVar6 * fVar5 * 0.5);
  pSVar1 = (this_00->super_FilterBase<rlottie::internal::model::Stroke>).model_;
  if ((pSVar1->mDash).mData.
      super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(pSVar1->mDash).mData.
               super__Vector_base<rlottie::internal::model::Property<float,_void>,_std::allocator<rlottie::internal::model::Property<float,_void>_>_>
               ._M_impl.super__Vector_impl_data + 8)) {
    lVar3 = __tls_get_addr(&PTR_00145f70);
    if (*(char *)(lVar3 + 0x58) == '\0') {
      updateContent();
    }
    result = (vector<float,_std::allocator<float>_> *)(lVar3 + 0x40);
    pfVar4 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(pointer *)(lVar3 + 0x48) != pfVar4) {
      *(pointer *)(lVar3 + 0x48) = pfVar4;
    }
    if (*(char *)(lVar3 + 0x58) == '\0') {
      updateContent();
    }
    model::Dash::getDashInfo
              (&((this_00->super_FilterBase<rlottie::internal::model::Stroke>).model_)->mDash,
               frameNo,result);
    if (*(char *)(lVar3 + 0x58) == '\0') {
      updateContent();
    }
    if ((result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start != *(pointer *)(lVar3 + 0x48)) {
      if (*(char *)(lVar3 + 0x58) == '\0') {
        updateContent();
      }
      pfVar2 = *(pointer *)(lVar3 + 0x48);
      for (pfVar4 = (result->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start; pfVar4 != pfVar2; pfVar4 = pfVar4 + 1) {
        *pfVar4 = *pfVar4 * fVar5 * 0.5;
      }
      if (*(char *)(lVar3 + 0x58) == '\0') {
        updateContent();
      }
      VDrawable::setDashInfo(&this_01->super_VDrawable,result);
    }
  }
  return local_54.a != '\0';
}

Assistant:

bool renderer::Stroke::updateContent(int frameNo, const VMatrix &matrix,
                                     float alpha)
{
    auto combinedAlpha = alpha * mModel.opacity(frameNo);
    auto color = mModel.color(frameNo).toColor(combinedAlpha);

    VBrush brush(color);
    mDrawable.setBrush(brush);
    float scale = matrix.scale();
    mDrawable.setStrokeInfo(mModel.capStyle(), mModel.joinStyle(),
                            mModel.miterLimit(),
                            mModel.strokeWidth(frameNo) * scale);

    if (mModel.hasDashInfo()) {
        Dash_Vector.clear();
        mModel.getDashInfo(frameNo, Dash_Vector);
        if (!Dash_Vector.empty()) {
            for (auto &elm : Dash_Vector) elm *= scale;
            mDrawable.setDashInfo(Dash_Vector);
        }
    }

    return !color.isTransparent();
}